

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

RawBrandedSchema * __thiscall
capnp::SchemaLoader::Impl::makeBranded
          (Impl *this,RawSchema *schema,ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> bindings)

{
  HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*> *this_00;
  Array<kj::_::HashBucket> *this_01;
  size_t *psVar1;
  RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
  **ppRVar2;
  uint uVar3;
  size_t sVar4;
  Entry *pEVar5;
  uint uVar6;
  RawBrandedSchema *pRVar7;
  long lVar8;
  ulong uVar9;
  Entry *__dest;
  Entry *pEVar10;
  HashBucket *pHVar11;
  uint uVar12;
  size_t sVar13;
  size_t in_R8;
  int iVar14;
  HashBucket *pHVar15;
  ulong capacity;
  size_t __n;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ArrayPtr<const_kj::_::HashBucket> oldBuckets;
  ArrayBuilder<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
  local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  RawBrandedSchema *local_58;
  Entry *local_50;
  SchemaBindingsPair key;
  
  if (bindings.size_ == 0) {
    pRVar7 = &schema->defaultBrand;
  }
  else {
    this_00 = &this->brands;
    key.schema = schema;
    key.scopeBindings = bindings.ptr;
    kj::
    Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
    ::find<0ul,capnp::(anonymous_namespace)::SchemaBindingsPair&>
              ((Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
                *)&local_88,(SchemaBindingsPair *)this_00);
    if (local_88.ptr == (Entry *)0x0) {
      pRVar7 = kj::Arena::allocate<capnp::_::RawBrandedSchema>(&this->arena);
      pRVar7->generic = (RawSchema *)0x0;
      pRVar7->scopes = (Scope *)0x0;
      pRVar7->dependencies = (Dependency *)0x0;
      pRVar7->scopeCount = 0;
      pRVar7->dependencyCount = 0;
      pRVar7->lazyInitializer = (Initializer *)0x0;
      local_68 = key.schema;
      uStack_60 = key.scopeBindings;
      pEVar10 = (this->brands).table.rows.builder.ptr;
      lVar8 = ((long)(this->brands).table.rows.builder.pos - (long)pEVar10) / 0x18;
      pHVar11 = (HashBucket *)(this->brands).table.indexes.buckets.size_;
      local_58 = pRVar7;
      if ((ulong)((long)pHVar11 * 2) < ((this->brands).table.indexes.erasedCount + lVar8) * 3 + 3) {
        this_01 = &(this->brands).table.indexes.buckets;
        oldBuckets.size_ = lVar8 * 3 + 3;
        oldBuckets.ptr = pHVar11;
        kj::_::rehash((Array<kj::_::HashBucket> *)&local_88,(_ *)this_01->ptr,oldBuckets,in_R8);
        kj::Array<kj::_::HashBucket>::operator=(this_01,(Array<kj::_::HashBucket> *)&local_88);
        kj::Array<kj::_::HashBucket>::~Array((Array<kj::_::HashBucket> *)&local_88);
        (this->brands).table.indexes.erasedCount = 0;
      }
      uVar6 = kj::
              hashCode<capnp::_::RawSchema_const*const&,capnp::_::RawBrandedSchema::Scope_const*const&>
                        ((RawSchema **)&local_68,(Scope **)&uStack_60);
      sVar4 = (this->brands).table.indexes.buckets.size_;
      uVar12 = (int)sVar4 - 1U & uVar6;
      pHVar11 = (HashBucket *)0x0;
      do {
        pHVar15 = (this->brands).table.indexes.buckets.ptr + uVar12;
        uVar3 = pHVar15->value;
        if (uVar3 == 1) {
          if (pHVar11 == (HashBucket *)0x0) {
            pHVar11 = pHVar15;
          }
        }
        else {
          if (uVar3 == 0) {
            if (pHVar11 != (HashBucket *)0x0) {
              psVar1 = &(this->brands).table.indexes.erasedCount;
              *psVar1 = *psVar1 - 1;
              pHVar15 = pHVar11;
            }
            *pHVar15 = (HashBucket)(((ulong)uVar6 | lVar8 << 0x20) + 0x200000000);
            pEVar10 = (this->brands).table.rows.builder.pos;
            if (pEVar10 == (this->brands).table.rows.builder.endPtr) {
              pEVar5 = (this_00->table).rows.builder.ptr;
              uVar9 = ((long)pEVar10 - (long)pEVar5) / 0x18;
              capacity = 4;
              if (pEVar10 != pEVar5) {
                capacity = uVar9 * 2;
              }
              if (capacity < uVar9) {
                (this->brands).table.rows.builder.pos = pEVar5 + capacity;
              }
              __dest = (Entry *)kj::_::HeapArrayDisposer::allocateImpl
                                          (0x18,0,capacity,(_func_void_void_ptr *)0x0,
                                           (_func_void_void_ptr *)0x0);
              local_88.ptr = __dest;
              local_88.endPtr = __dest + capacity;
              local_88.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
              pEVar10 = (this->brands).table.rows.builder.ptr;
              __n = (long)(this->brands).table.rows.builder.pos - (long)pEVar10;
              local_50 = local_88.endPtr;
              pEVar5 = __dest;
              if (__n != 0) {
                memcpy(__dest,pEVar10,__n);
                pEVar5 = local_88.ptr;
              }
              local_88.ptr = pEVar5;
              local_88.pos = (RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
                              *)((long)__dest + __n);
              kj::
              ArrayBuilder<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
              ::dispose((ArrayBuilder<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
                         *)this_00);
              (this->brands).table.rows.builder.ptr = __dest;
              (this->brands).table.rows.builder.pos =
                   (RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
                    *)((long)__dest + __n);
              (this->brands).table.rows.builder.endPtr = local_50;
              (this->brands).table.rows.builder.disposer =
                   (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
              local_88.ptr = (Entry *)0x0;
              local_88.pos = (RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
                              *)0x0;
              local_88.endPtr = (Entry *)0x0;
              kj::
              ArrayBuilder<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
              ::dispose(&local_88);
              pEVar10 = (this->brands).table.rows.builder.pos;
            }
            pEVar10->value = local_58;
            (pEVar10->key).schema = local_68;
            (pEVar10->key).scopeBindings = uStack_60;
            ppRVar2 = &(this->brands).table.rows.builder.pos;
            *ppRVar2 = *ppRVar2 + 1;
            pRVar7->generic = schema;
            pRVar7->scopes = bindings.ptr;
            pRVar7->scopeCount = (uint32_t)bindings.size_;
            pRVar7->lazyInitializer = &(this->brandedInitializer).super_Initializer;
            return pRVar7;
          }
          if (pHVar15->hash == uVar6) {
            pEVar5 = pEVar10 + (uVar3 - 2);
            auVar16._0_4_ = -(uint)(*(int *)&(pEVar5->key).schema == (int)local_68);
            auVar16._4_4_ = -(uint)(*(int *)((long)&(pEVar5->key).schema + 4) == local_68._4_4_);
            auVar16._8_4_ = -(uint)(*(int *)&(pEVar5->key).scopeBindings == (int)uStack_60);
            auVar16._12_4_ =
                 -(uint)(*(int *)((long)&(pEVar5->key).scopeBindings + 4) == uStack_60._4_4_);
            auVar17._4_4_ = auVar16._0_4_;
            auVar17._0_4_ = auVar16._4_4_;
            auVar17._8_4_ = auVar16._12_4_;
            auVar17._12_4_ = auVar16._8_4_;
            iVar14 = movmskpd((uVar3 - 2) * 0x18,auVar17 & auVar16);
            if (iVar14 == 3) {
              kj::_::throwDuplicateTableRow();
            }
          }
        }
        sVar13 = (ulong)uVar12 + 1;
        uVar12 = (uint)sVar13;
        if (sVar13 == sVar4) {
          uVar12 = 0;
        }
      } while( true );
    }
    pRVar7 = (local_88.ptr)->value;
  }
  return pRVar7;
}

Assistant:

const _::RawBrandedSchema* SchemaLoader::Impl::makeBranded(
    const _::RawSchema* schema, kj::ArrayPtr<const _::RawBrandedSchema::Scope> bindings) {
  if (bindings.size() == 0) {
    // `defaultBrand` is the version where all type parameters are bound to `AnyPointer`.
    return &schema->defaultBrand;
  }

  SchemaBindingsPair key { schema, bindings.begin() };
  KJ_IF_SOME(existing, brands.find(key)) {
    return existing;
  } else {
    auto& brand = arena.allocate<_::RawBrandedSchema>();
    memset(&brand, 0, sizeof(brand));
    brands.insert(key, &brand);

    brand.generic = schema;
    brand.scopes = bindings.begin();
    brand.scopeCount = bindings.size();
    brand.lazyInitializer = &brandedInitializer;
    return &brand;
  }